

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse.c
# Opt level: O3

void verify_archive_file(char *name,archive_contents *ac)

{
  char cVar1;
  long lVar2;
  int iVar3;
  wchar_t wVar4;
  archive_conflict *a;
  char *pcVar5;
  archive_contents *paVar6;
  contents *pcVar7;
  long v2;
  char *pcVar8;
  size_t sVar9;
  contents actual;
  archive_entry *ae;
  void *p;
  long local_68;
  size_t local_60;
  char *local_58;
  archive_entry *local_50;
  archive_conflict *local_48;
  char *local_40;
  archive_contents *local_38;
  
  extract_reference_file(name);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'º',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'»',(uint)(iVar3 == 0),"0 == archive_read_support_filter_all(a)",(void *)0x0);
  wVar4 = archive_read_support_format_tar((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'¼',(uint)(wVar4 == L'\0'),"0 == archive_read_support_format_tar(a)",
                   (void *)0x0);
  failure("Can\'t open %s",name);
  wVar4 = archive_read_open_filename(a,name,3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'¾',(uint)(wVar4 == L'\0'),"0 == archive_read_open_filename(a, name, 3)",
                   (void *)0x0);
  paVar6 = files;
  local_48 = a;
  do {
    pcVar7 = paVar6->contents;
    iVar3 = archive_read_next_header((archive *)a,&local_50);
    wVar4 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                ,L'Ã',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",a);
    if (wVar4 == L'\0') {
      iVar3 = archive_read_free((archive *)a);
      wVar4 = L'Ä';
      goto LAB_0016d278;
    }
    failure("Name mismatch in archive %s",name);
    pcVar8 = paVar6->filename;
    local_38 = paVar6;
    pcVar5 = archive_entry_pathname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
               ,L'È',pcVar8,"ac->filename",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    wVar4 = archive_entry_is_encrypted(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'É',(long)wVar4,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar3 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'Ê',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
    v2 = pcVar7->o;
    sVar9 = pcVar7->s;
    pcVar8 = pcVar7->d;
    iVar3 = archive_read_data_block((archive *)a,&local_40,&local_60,&local_68);
    if (iVar3 == 0) {
      pcVar7 = pcVar7 + 1;
      pcVar5 = local_40;
      lVar2 = local_68;
      do {
        for (; local_58 = pcVar5, local_68 = lVar2, local_60 != 0; local_60 = local_60 - 1) {
          cVar1 = *local_58;
          if (lVar2 < v2) {
            failure("%s: pad at offset %jd should be zero",name,lVar2);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                ,L'Ú',(long)cVar1,"c",0,"0",(void *)0x0);
          }
          else {
            if (lVar2 != v2) {
              failure("%s: Unexpected trailing data",name);
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                               ,L'ì',(uint)(local_68 <= v2),"actual.o <= expect.o",(void *)0x0);
              archive_read_free((archive *)local_48);
              return;
            }
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                ,L'ß',(long)cVar1,"c",(long)*pcVar8,"*expect.d",(void *)0x0);
            sVar9 = sVar9 - 1;
            if (sVar9 == 0) {
              v2 = pcVar7->o;
              sVar9 = pcVar7->s;
              pcVar8 = pcVar7->d;
              pcVar7 = pcVar7 + 1;
            }
            else {
              pcVar8 = pcVar8 + 1;
              v2 = lVar2 + 1;
            }
          }
          pcVar5 = local_58 + 1;
          lVar2 = local_68 + 1;
        }
        iVar3 = archive_read_data_block((archive *)local_48,&local_40,&local_60,&local_68);
        pcVar5 = local_40;
        lVar2 = local_68;
      } while (iVar3 == 0);
    }
    failure("%s: should be end of entry",name);
    a = local_48;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'ö',(long)iVar3,"err",1,"ARCHIVE_EOF",local_48);
    failure("%s: Size returned at EOF must be zero",name);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'ø',(long)(int)local_60,"(int)actual.s",0,"0",(void *)0x0);
    failure("%s: Offset of final empty chunk must be same as file size",name);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'ú',local_68,"actual.o",v2,"expect.o",(void *)0x0);
    paVar6 = local_38 + 1;
  } while (local_38[1].filename != (char *)0x0);
  iVar3 = archive_read_next_header((archive *)a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                      ,L'Ā',1,"ARCHIVE_EOF",(long)iVar3,"err",a);
  iVar3 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                      ,L'Ă',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",a);
  iVar3 = archive_read_free((archive *)a);
  wVar4 = L'ă';
LAB_0016d278:
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                      ,wVar4,0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
verify_archive_file(const char *name, struct archive_contents *ac)
{
	struct archive_entry *ae;
	int err;
	/* data, size, offset of next expected block. */
	struct contents expect;
	/* data, size, offset of block read from archive. */
	struct contents actual;
	const void *p;
	struct archive *a;

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assert(0 == archive_read_support_filter_all(a));
	assert(0 == archive_read_support_format_tar(a));
	failure("Can't open %s", name);
	assert(0 == archive_read_open_filename(a, name, 3));

	while (ac->filename != NULL) {
		struct contents *cts = ac->contents;

		if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae))) {
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			return;
		}
		failure("Name mismatch in archive %s", name);
		assertEqualString(ac->filename, archive_entry_pathname(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		expect = *cts++;
		while (0 == (err = archive_read_data_block(a,
				 &p, &actual.s, &actual.o))) {
			actual.d = p;
			while (actual.s > 0) {
				char c = *actual.d;
				if(actual.o < expect.o) {
					/*
					 * Any byte before the expected
					 * data must be NULL.
					 */
					failure("%s: pad at offset %jd "
						"should be zero", name,
						(intmax_t)actual.o);
					assertEqualInt(c, 0);
				} else if (actual.o == expect.o) {
					/*
					 * Data at matching offsets must match.
					 */
					assertEqualInt(c, *expect.d);
					expect.d++;
					expect.o++;
					expect.s--;
					/* End of expected? step to next expected. */
					if (expect.s <= 0)
						expect = *cts++;
				} else {
					/*
					 * We found data beyond that expected.
					 */
					failure("%s: Unexpected trailing data",
					    name);
					assert(actual.o <= expect.o);
					archive_read_free(a);
					return;
				}
				actual.d++;
				actual.o++;
				actual.s--;
			}
		}
		failure("%s: should be end of entry", name);
		assertEqualIntA(a, err, ARCHIVE_EOF);
		failure("%s: Size returned at EOF must be zero", name);
		assertEqualInt((int)actual.s, 0);
		failure("%s: Offset of final empty chunk must be same as file size", name);
		assertEqualInt(actual.o, expect.o);
		/* Step to next file description. */
		++ac;
	}

	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_EOF, err);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}